

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O0

void createVars(vec<vec<BoolView>_> *x,int n,int m)

{
  BoolView *this;
  BoolView *pBVar1;
  int in_EDX;
  int in_ESI;
  vec<vec<BoolView>_> *in_RDI;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  vec<vec<BoolView>_> *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffcc;
  vec<BoolView> *in_stack_ffffffffffffffd0;
  undefined4 local_18;
  undefined4 local_14;
  
  vec<vec<BoolView>_>::growTo
            (in_stack_ffffffffffffffc0,(uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  for (local_14 = 0; (int)local_14 < in_ESI; local_14 = local_14 + 1) {
    vec<vec<BoolView>_>::operator[](in_RDI,local_14);
    vec<BoolView>::growTo(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    for (local_18 = 0; (int)local_18 < in_EDX; local_18 = local_18 + 1) {
      newBoolVar((int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      this = (BoolView *)vec<vec<BoolView>_>::operator[](in_RDI,local_14);
      pBVar1 = vec<BoolView>::operator[]((vec<BoolView> *)this,local_18);
      BoolView::operator=(this,pBVar1);
      BoolView::~BoolView((BoolView *)0x2a8153);
    }
  }
  return;
}

Assistant:

void createVars(vec<vec<BoolView> >& x, int n, int m) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i].growTo(m);
		for (int j = 0; j < m; j++) {
			x[i][j] = newBoolVar();
		}
	}
}